

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_mfp.h
# Opt level: O2

member_function_pointer<dlib::toggle_button_&,_void,_void,_void> * __thiscall
dlib::make_mfp<dlib::open_file_box_helper::box_win,dlib::toggle_button&>
          (member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *__return_storage_ptr__,
          dlib *this,box_win *object,mfp_pointer_type cb)

{
  (__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.data =
       __return_storage_ptr__;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.mem + 8) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.mem + 0x10) = 2;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.mem + 0x18) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.mem + 0x20) = 0;
  (__return_storage_ptr__->super_mfp_kernel_1_base_class<1UL>).mp_memory.mem.void_ptr =
       &PTR__mp_base_base_00335038;
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void>::
  set<dlib::open_file_box_helper::box_win>
            (__return_storage_ptr__,(box_win *)this,(mfp_pointer_type)object);
  return __return_storage_ptr__;
}

Assistant:

member_function_pointer<A1> make_mfp (
        T& object,
        void (T::*cb)(A1)
    )
    {
        member_function_pointer<A1> temp;
        temp.set(object, cb);
        return temp;
    }